

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

plutovg_path_t * plutovg_path_clone(plutovg_path_t *path)

{
  int iVar1;
  int iVar2;
  plutovg_path_t *ppVar3;
  plutovg_path_element_t *ppVar4;
  int iVar5;
  int iVar6;
  plutovg_path_element_t *__src;
  
  ppVar3 = plutovg_path_create();
  __src = (path->elements).data;
  if ((__src != (plutovg_path_element_t *)0x0) && (iVar6 = (path->elements).size, 0 < iVar6)) {
    iVar1 = (ppVar3->elements).size;
    iVar5 = (ppVar3->elements).capacity;
    if (iVar5 < iVar1 + iVar6) {
      iVar2 = 8;
      if (iVar5 != 0) {
        iVar2 = iVar5;
      }
      do {
        iVar5 = iVar2;
        iVar2 = iVar5 * 2;
      } while (iVar5 < iVar1 + iVar6);
      ppVar4 = (plutovg_path_element_t *)realloc((ppVar3->elements).data,(long)iVar5 << 3);
      (ppVar3->elements).data = ppVar4;
      (ppVar3->elements).capacity = iVar5;
      __src = (path->elements).data;
      iVar6 = (path->elements).size;
    }
    else {
      ppVar4 = (ppVar3->elements).data;
    }
    memcpy(ppVar4 + iVar1,__src,(long)iVar6 << 3);
    (ppVar3->elements).size = (path->elements).size + iVar1;
  }
  ppVar3->start_point = path->start_point;
  iVar6 = path->num_contours;
  ppVar3->num_points = path->num_points;
  ppVar3->num_contours = iVar6;
  ppVar3->num_curves = path->num_curves;
  return ppVar3;
}

Assistant:

plutovg_path_t* plutovg_path_clone(const plutovg_path_t* path)
{
    plutovg_path_t* clone = plutovg_path_create();
    plutovg_array_append(clone->elements, path->elements);
    clone->start_point = path->start_point;
    clone->num_points = path->num_points;
    clone->num_contours = path->num_contours;
    clone->num_curves = path->num_curves;
    return clone;
}